

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  Curl_easy *pCVar1;
  char *pcVar2;
  bool bVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  CURLcode CVar7;
  byte *pbVar8;
  undefined7 in_register_00000031;
  CURLcode unaff_R12D;
  curl_slist *pcVar9;
  byte *pbVar10;
  curl_slist *h [2];
  long local_68;
  curl_slist *local_58 [3];
  long local_40;
  Curl_send_buffer *local_38;
  
  local_38 = req_buffer;
  bVar5 = 2;
  if (((int)CONCAT71(in_register_00000031,is_connect) == 0) &&
     (bVar5 = 0, (conn->bits).httpproxy == true)) {
    bVar5 = (conn->bits).tunnel_proxy ^ 1;
  }
  pCVar1 = conn->data;
  if (bVar5 == 2) {
    if ((pCVar1->set).sep_headers != true) goto LAB_001129ca;
    local_58[0] = (pCVar1->set).proxyheaders;
  }
  else {
    if (bVar5 == 1) {
      local_58[0] = (pCVar1->set).headers;
      local_68 = 1;
      if ((pCVar1->set).sep_headers == true) {
        local_58[1] = (pCVar1->set).proxyheaders;
        local_68 = 2;
      }
      goto LAB_001129df;
    }
LAB_001129ca:
    local_58[0] = (pCVar1->set).headers;
  }
  local_68 = 1;
LAB_001129df:
  local_40 = 0;
  do {
    pcVar9 = local_58[local_40];
    while (pcVar9 != (curl_slist *)0x0) {
      pcVar2 = pcVar9->data;
      pbVar8 = (byte *)strchr(pcVar2,0x3a);
      if (pbVar8 == (byte *)0x0) {
        pbVar8 = (byte *)strchr(pcVar2,0x3b);
        pbVar4 = pbVar8;
        if (pbVar8 == (byte *)0x0) {
LAB_00112a4f:
          pbVar8 = (byte *)0x0;
          goto LAB_00112a52;
        }
        do {
          pbVar10 = pbVar4;
          if (pbVar10[1] == 0) break;
          iVar6 = Curl_isspace((uint)pbVar10[1]);
          pbVar4 = pbVar10 + 1;
        } while (iVar6 != 0);
        if (pbVar10[1] != 0) goto LAB_00112a4f;
        if (*pbVar10 != 0x3b) goto LAB_00112a52;
        *pbVar10 = 0x3a;
      }
      else {
LAB_00112a52:
        pbVar10 = (byte *)0x0;
      }
      if (pbVar8 == (byte *)0x0) {
LAB_00112b7f:
        pcVar9 = pcVar9->next;
        bVar3 = true;
      }
      else {
        do {
          pbVar8 = pbVar8 + 1;
          if (*pbVar8 == 0) break;
          iVar6 = Curl_isspace((uint)*pbVar8);
        } while (iVar6 != 0);
        if ((pbVar10 == (byte *)0x0) && (*pbVar8 == 0)) goto LAB_00112b7f;
        if (((((((conn->allocptr).host == (char *)0x0) ||
               (iVar6 = curl_strnequal("Host:",pcVar9->data,5), iVar6 == 0)) &&
              ((((pCVar1->set).httpreq != HTTPREQ_POST_FORM ||
                (iVar6 = curl_strnequal("Content-Type:",pcVar9->data,0xd), iVar6 == 0)) &&
               (((pCVar1->set).httpreq != HTTPREQ_POST_MIME ||
                (iVar6 = curl_strnequal("Content-Type:",pcVar9->data,0xd), iVar6 == 0)))))) &&
             ((((conn->bits).authneg != true ||
               (iVar6 = curl_strnequal("Content-Length:",pcVar9->data,0xf), iVar6 == 0)) &&
              (((conn->allocptr).te == (char *)0x0 ||
               (iVar6 = curl_strnequal("Connection:",pcVar9->data,0xb), iVar6 == 0)))))) &&
            ((conn->httpversion != 0x14 ||
             (iVar6 = curl_strnequal("Transfer-Encoding:",pcVar9->data,0x12), iVar6 == 0)))) &&
           (((iVar6 = curl_strnequal("Authorization:",pcVar9->data,0xe), iVar6 == 0 &&
             (iVar6 = curl_strnequal("Cookie:",pcVar9->data,7), iVar6 == 0)) ||
            (((((pCVar1->state).this_is_a_follow != true ||
               (pcVar2 = (pCVar1->state).first_host, pcVar2 == (char *)0x0)) ||
              ((pCVar1->set).allow_auth_to_other_hosts != false)) ||
             (iVar6 = Curl_strcasecompare(pcVar2,(conn->host).name), iVar6 != 0)))))) {
          CVar7 = Curl_add_bufferf(&local_38,"%s\r\n",pcVar9->data);
        }
        else {
          CVar7 = CURLE_OK;
        }
        if (pbVar10 != (byte *)0x0) {
          *pbVar10 = 0x3b;
        }
        if (CVar7 == CURLE_OK) goto LAB_00112b7f;
        bVar3 = false;
        unaff_R12D = CVar7;
      }
      if (!bVar3) {
        return unaff_R12D;
      }
    }
    local_40 = local_40 + 1;
    if (local_40 == local_68) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  struct Curl_easy *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* send no-value custom header if terminated by semicolon */
              *ptr = ':';
              semicolonp = ptr;
            }
          }
          ptr = optr;
        }
      }
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", headers->data))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection:", headers->data))
            ;
          else if((conn->httpversion == 20) &&
                  checkprefix("Transfer-Encoding:", headers->data))
            /* HTTP/2 doesn't support chunked requests */
            ;
          else if((checkprefix("Authorization:", headers->data) ||
                   checkprefix("Cookie:", headers->data)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  (data->state.this_is_a_follow &&
                   data->state.first_host &&
                   !data->set.allow_auth_to_other_hosts &&
                   !strcasecompare(data->state.first_host, conn->host.name)))
            ;
          else {
            result = Curl_add_bufferf(&req_buffer, "%s\r\n", headers->data);
          }
          if(semicolonp)
            *semicolonp = ';'; /* put back the semicolon */
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}